

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::updateGeometries(QTableView *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ScrollMode SVar6;
  QTableViewPrivate *pQVar7;
  int *piVar8;
  QRect *pQVar9;
  QScrollBar *this_00;
  QHeaderViewPrivate *this_01;
  long in_FS_OFFSET;
  int visibleRows;
  int logical_1;
  int row;
  int height_1;
  int viewportHeight;
  int rowCount;
  int visibleColumns;
  int logical;
  int column;
  int width_1;
  int viewportWidth;
  int columnCount;
  int verticalLength;
  int horizontalLength;
  int horizontalTop;
  int verticalLeft;
  bool reverse;
  QTableViewPrivate *d;
  int rowsInViewport;
  int columnsInViewport;
  QSize max;
  QSize vsize;
  QRect vg;
  int height;
  int width;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  QAbstractSliderPrivate *in_stack_fffffffffffffea0;
  QHeaderView *in_stack_fffffffffffffea8;
  QAbstractScrollArea *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  QHeaderViewPrivate *in_stack_fffffffffffffec0;
  int local_c4;
  int local_c0;
  int local_ac;
  int local_a8;
  int local_78;
  int local_74 [5];
  int local_60;
  int local_5c;
  QSize local_58;
  QSize local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  int local_38;
  undefined8 local_34;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  undefined8 local_1c;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = d_func((QTableView *)0x8bcab9);
  if ((pQVar7->geometryRecursionBlock & 1U) == 0) {
    pQVar7->geometryRecursionBlock = true;
    local_c = 0;
    bVar1 = QWidget::isHidden((QWidget *)0x8bcb05);
    if (!bVar1) {
      local_10 = QWidget::minimumWidth((QWidget *)in_stack_fffffffffffffea0);
      local_1c = (**(code **)(*(long *)&(pQVar7->verticalHeader->super_QAbstractItemView).
                                        super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x70)
                 )();
      local_14 = QSize::width((QSize *)0x8bcb52);
      piVar8 = qMax<int>(&local_10,&local_14);
      local_c = *piVar8;
      local_20 = QWidget::maximumWidth((QWidget *)in_stack_fffffffffffffea0);
      piVar8 = qMin<int>(&local_c,&local_20);
      local_c = *piVar8;
    }
    local_24 = 0;
    bVar1 = QWidget::isHidden((QWidget *)0x8bcbcf);
    if (!bVar1) {
      local_28 = QWidget::minimumHeight((QWidget *)in_stack_fffffffffffffea0);
      local_34 = (**(code **)(*(long *)&(pQVar7->horizontalHeader->super_QAbstractItemView).
                                        super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x70)
                 )();
      local_2c = QSize::height((QSize *)0x8bcc1c);
      piVar8 = qMax<int>(&local_28,&local_2c);
      local_24 = *piVar8;
      local_38 = QWidget::maximumHeight((QWidget *)in_stack_fffffffffffffea0);
      piVar8 = qMin<int>(&local_24,&local_38);
      local_24 = *piVar8;
    }
    bVar1 = QWidget::isRightToLeft((QWidget *)0x8bcc87);
    iVar3 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
    iVar2 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    if (bVar1) {
      QAbstractScrollArea::setViewportMargins
                (in_stack_fffffffffffffeb0,iVar2,(int)in_stack_fffffffffffffea8,iVar3,
                 (int)in_stack_fffffffffffffea0);
    }
    else {
      QAbstractScrollArea::setViewportMargins
                (in_stack_fffffffffffffeb0,iVar2,(int)in_stack_fffffffffffffea8,iVar3,
                 (int)in_stack_fffffffffffffea0);
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar9 = QWidget::geometry((pQVar7->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.viewport);
    local_48._0_4_ = pQVar9->x1;
    local_48._4_4_ = pQVar9->y1;
    local_40._0_4_ = pQVar9->x2;
    local_40._4_4_ = pQVar9->y2;
    if (bVar1) {
      QRect::right((QRect *)0x8bcd3e);
    }
    else {
      QRect::left((QRect *)0x8bcd57);
    }
    QRect::top((QRect *)0x8bcda2);
    QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    QWidget::setGeometry
              ((QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(int)in_stack_fffffffffffffeb0,
               (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8);
    bVar1 = QWidget::isHidden((QWidget *)0x8bcdfa);
    if (bVar1) {
      QMetaObject::invokeMethod<>
                ((QObject *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 (char *)in_stack_fffffffffffffeb0);
    }
    QRect::top((QRect *)0x8bce28);
    QRect::left((QRect *)0x8bce57);
    QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    QWidget::setGeometry
              ((QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(int)in_stack_fffffffffffffeb0,
               (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8);
    bVar1 = QWidget::isHidden((QWidget *)0x8bcea3);
    if (bVar1) {
      QMetaObject::invokeMethod<>
                ((QObject *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 (char *)in_stack_fffffffffffffeb0);
    }
    bVar1 = QWidget::isHidden((QWidget *)0x8bced8);
    if ((bVar1) || (bVar1 = QWidget::isHidden((QWidget *)0x8bcef0), bVar1)) {
      QWidget::setHidden((QWidget *)in_stack_fffffffffffffea0,
                         SUB41((uint)in_stack_fffffffffffffe9c >> 0x18,0));
    }
    else {
      QWidget::setHidden((QWidget *)in_stack_fffffffffffffea0,
                         SUB41((uint)in_stack_fffffffffffffe9c >> 0x18,0));
      QWidget::setGeometry
                ((QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(int)in_stack_fffffffffffffeb0,
                 (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8);
    }
    local_50 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_50 = QWidget::size((QWidget *)
                             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_58 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = QAbstractScrollArea::maximumViewportSize
                         ((QAbstractScrollArea *)in_stack_fffffffffffffec0);
    iVar2 = QHeaderView::length((QHeaderView *)in_stack_fffffffffffffea0);
    iVar3 = QHeaderView::length((QHeaderView *)in_stack_fffffffffffffea0);
    iVar4 = QSize::width((QSize *)0x8bcfea);
    if ((iVar2 <= iVar4) && (iVar2 = QSize::height((QSize *)0x8bd000), iVar3 <= iVar2)) {
      local_50 = local_58;
    }
    iVar2 = QHeaderView::count((QHeaderView *)in_stack_fffffffffffffea0);
    iVar4 = QSize::width((QSize *)0x8bd041);
    local_5c = 0;
    local_a8 = 0;
    local_ac = iVar2;
    while (local_ac = local_ac + -1, -1 < local_ac) {
      QHeaderView::logicalIndex
                (in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      bVar1 = QHeaderView::isSectionHidden
                        ((QHeaderView *)
                         CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      if (!bVar1) {
        iVar5 = QHeaderView::sectionSize
                          ((QHeaderView *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
        local_a8 = iVar5 + local_a8;
        if (iVar4 < local_a8) break;
        local_5c = local_5c + 1;
      }
    }
    local_60 = 1;
    piVar8 = qMax<int>(&local_5c,&local_60);
    local_5c = *piVar8;
    SVar6 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)in_stack_fffffffffffffea0);
    if (SVar6 == ScrollPerItem) {
      iVar4 = QHeaderView::hiddenSectionCount((QHeaderView *)in_stack_fffffffffffffea0);
      QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffea0);
      QAbstractSlider::setRange
                ((QAbstractSlider *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffebc,
                 in_stack_fffffffffffffeb8);
      QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffea0);
      QAbstractSlider::setPageStep
                ((QAbstractSlider *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      if (iVar2 - iVar4 <= local_5c) {
        QHeaderView::setOffset
                  ((QHeaderView *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      }
      QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffea0);
      QAbstractSlider::setSingleStep
                ((QAbstractSlider *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    }
    else {
      QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffea0);
      QSize::width((QSize *)0x8bd234);
      QAbstractSlider::setPageStep
                ((QAbstractSlider *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffea0);
      QSize::width((QSize *)0x8bd26a);
      QAbstractSlider::setRange
                ((QAbstractSlider *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffebc,
                 in_stack_fffffffffffffeb8);
      QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffea0);
      QScrollBar::d_func((QScrollBar *)0x8bd291);
      local_74[4] = QSize::width((QSize *)0x8bd2a3);
      local_74[4] = local_74[4] / (local_5c + 1);
      local_74[3] = 2;
      qMax<int>(local_74 + 4,local_74 + 3);
      QAbstractSliderPrivate::itemviewChangeSingleStep
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    }
    iVar2 = QHeaderView::count((QHeaderView *)in_stack_fffffffffffffea0);
    iVar4 = QSize::height((QSize *)0x8bd30b);
    local_74[2] = 0;
    local_c0 = 0;
    local_c4 = iVar2;
    while (local_c4 = local_c4 + -1, -1 < local_c4) {
      QHeaderView::logicalIndex
                (in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      bVar1 = QHeaderView::isSectionHidden
                        ((QHeaderView *)
                         CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      if (!bVar1) {
        iVar5 = QHeaderView::sectionSize
                          ((QHeaderView *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
        local_c0 = iVar5 + local_c0;
        if (iVar4 < local_c0) break;
        local_74[2] = local_74[2] + 1;
      }
    }
    local_74[1] = 1;
    piVar8 = qMax<int>(local_74 + 2,local_74 + 1);
    local_74[2] = *piVar8;
    SVar6 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)in_stack_fffffffffffffea0);
    if (SVar6 == ScrollPerItem) {
      iVar4 = QHeaderView::hiddenSectionCount((QHeaderView *)in_stack_fffffffffffffea0);
      QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffea0);
      QAbstractSlider::setRange
                ((QAbstractSlider *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffebc,
                 in_stack_fffffffffffffeb8);
      SVar6 = (ScrollMode)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
      QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffea0);
      QAbstractSlider::setPageStep
                ((QAbstractSlider *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      iVar3 = in_stack_fffffffffffffebc;
      if (iVar2 - iVar4 <= local_74[2]) {
        QHeaderView::setOffset
                  ((QHeaderView *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   SVar6);
        iVar3 = in_stack_fffffffffffffebc;
      }
      QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffea0);
      QAbstractSlider::setSingleStep
                ((QAbstractSlider *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    }
    else {
      this_00 = QAbstractScrollArea::verticalScrollBar
                          ((QAbstractScrollArea *)in_stack_fffffffffffffea0);
      QSize::height((QSize *)0x8bd4fe);
      QAbstractSlider::setPageStep
                ((QAbstractSlider *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      in_stack_fffffffffffffec0 =
           (QHeaderViewPrivate *)
           QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffea0);
      QSize::height((QSize *)0x8bd534);
      QAbstractSlider::setRange(&this_00->super_QAbstractSlider,iVar3,in_stack_fffffffffffffeb8);
      SVar6 = (ScrollMode)((ulong)this_00 >> 0x20);
      QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffea0);
      QScrollBar::d_func((QScrollBar *)0x8bd55b);
      local_74[0] = QSize::height((QSize *)0x8bd56d);
      local_74[0] = local_74[0] / (local_74[2] + 1);
      local_78 = 2;
      qMax<int>(local_74,&local_78);
      QAbstractSliderPrivate::itemviewChangeSingleStep
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    }
    this_01 = QHeaderView::d_func((QHeaderView *)0x8bd5c1);
    QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this_01);
    QAbstractItemView::verticalScrollMode((QAbstractItemView *)this_01);
    QHeaderViewPrivate::setScrollOffset
              (in_stack_fffffffffffffec0,(QScrollBar *)CONCAT44(iVar3,in_stack_fffffffffffffeb8),
               SVar6);
    pQVar7->geometryRecursionBlock = false;
    QAbstractItemView::updateGeometries((QAbstractItemView *)this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::updateGeometries()
{
    Q_D(QTableView);
    if (d->geometryRecursionBlock)
        return;
    d->geometryRecursionBlock = true;

    int width = 0;
    if (!d->verticalHeader->isHidden()) {
        width = qMax(d->verticalHeader->minimumWidth(), d->verticalHeader->sizeHint().width());
        width = qMin(width, d->verticalHeader->maximumWidth());
    }
    int height = 0;
    if (!d->horizontalHeader->isHidden()) {
        height = qMax(d->horizontalHeader->minimumHeight(), d->horizontalHeader->sizeHint().height());
        height = qMin(height, d->horizontalHeader->maximumHeight());
    }
    bool reverse = isRightToLeft();
     if (reverse)
         setViewportMargins(0, height, width, 0);
     else
         setViewportMargins(width, height, 0, 0);

    // update headers

    QRect vg = d->viewport->geometry();

    int verticalLeft = reverse ? vg.right() + 1 : (vg.left() - width);
    d->verticalHeader->setGeometry(verticalLeft, vg.top(), width, vg.height());
    if (d->verticalHeader->isHidden())
        QMetaObject::invokeMethod(d->verticalHeader, "updateGeometries");

    int horizontalTop = vg.top() - height;
    d->horizontalHeader->setGeometry(vg.left(), horizontalTop, vg.width(), height);
    if (d->horizontalHeader->isHidden())
        QMetaObject::invokeMethod(d->horizontalHeader, "updateGeometries");

#if QT_CONFIG(abstractbutton)
    // update cornerWidget
    if (d->horizontalHeader->isHidden() || d->verticalHeader->isHidden()) {
        d->cornerWidget->setHidden(true);
    } else {
        d->cornerWidget->setHidden(false);
        d->cornerWidget->setGeometry(verticalLeft, horizontalTop, width, height);
    }
#endif

    // update scroll bars

    // ### move this block into the if
    QSize vsize = d->viewport->size();
    QSize max = maximumViewportSize();
    const int horizontalLength = d->horizontalHeader->length();
    const int verticalLength = d->verticalHeader->length();
    if (max.width() >= horizontalLength && max.height() >= verticalLength)
        vsize = max;

    // horizontal scroll bar
    const int columnCount = d->horizontalHeader->count();
    const int viewportWidth = vsize.width();
    int columnsInViewport = 0;
    for (int width = 0, column = columnCount - 1; column >= 0; --column) {
        int logical = d->horizontalHeader->logicalIndex(column);
        if (!d->horizontalHeader->isSectionHidden(logical)) {
            width += d->horizontalHeader->sectionSize(logical);
            if (width > viewportWidth)
                break;
            ++columnsInViewport;
        }
    }
    columnsInViewport = qMax(columnsInViewport, 1); //there must be always at least 1 column

    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {
        const int visibleColumns = columnCount - d->horizontalHeader->hiddenSectionCount();
        horizontalScrollBar()->setRange(0, visibleColumns - columnsInViewport);
        horizontalScrollBar()->setPageStep(columnsInViewport);
        if (columnsInViewport >= visibleColumns)
            d->horizontalHeader->setOffset(0);
        horizontalScrollBar()->setSingleStep(1);
    } else { // ScrollPerPixel
        horizontalScrollBar()->setPageStep(vsize.width());
        horizontalScrollBar()->setRange(0, horizontalLength - vsize.width());
        horizontalScrollBar()->d_func()->itemviewChangeSingleStep(qMax(vsize.width() / (columnsInViewport + 1), 2));
    }

    // vertical scroll bar
    const int rowCount = d->verticalHeader->count();
    const int viewportHeight = vsize.height();
    int rowsInViewport = 0;
    for (int height = 0, row = rowCount - 1; row >= 0; --row) {
        int logical = d->verticalHeader->logicalIndex(row);
        if (!d->verticalHeader->isSectionHidden(logical)) {
            height += d->verticalHeader->sectionSize(logical);
            if (height > viewportHeight)
                break;
            ++rowsInViewport;
        }
    }
    rowsInViewport = qMax(rowsInViewport, 1); //there must be always at least 1 row

    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        const int visibleRows = rowCount - d->verticalHeader->hiddenSectionCount();
        verticalScrollBar()->setRange(0, visibleRows - rowsInViewport);
        verticalScrollBar()->setPageStep(rowsInViewport);
        if (rowsInViewport >= visibleRows)
            d->verticalHeader->setOffset(0);
        verticalScrollBar()->setSingleStep(1);
    } else { // ScrollPerPixel
        verticalScrollBar()->setPageStep(vsize.height());
        verticalScrollBar()->setRange(0, verticalLength - vsize.height());
        verticalScrollBar()->d_func()->itemviewChangeSingleStep(qMax(vsize.height() / (rowsInViewport + 1), 2));
    }
    d->verticalHeader->d_func()->setScrollOffset(verticalScrollBar(), verticalScrollMode());

    d->geometryRecursionBlock = false;
    QAbstractItemView::updateGeometries();
}